

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_spawn(Executor *this,size_t N)

{
  pointer pWVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  size_t n;
  unique_lock<std::mutex> lock;
  mutex mutex;
  condition_variable cond;
  unsigned_long local_c0;
  unique_lock<std::mutex> local_b8;
  reference_wrapper<unsigned_long> local_a8;
  reference_wrapper<std::condition_variable> local_a0;
  reference_wrapper<std::mutex> local_98;
  reference_wrapper<tf::Worker> local_90;
  __native_type local_88;
  __native_type local_60;
  
  local_88._16_8_ = 0;
  local_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.__align = 0;
  local_88._8_8_ = 0;
  local_88.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)&local_60.__data);
  local_c0 = 0;
  if (N != 0) {
    lVar4 = 0;
    lVar3 = 0;
    sVar2 = 0;
    do {
      pWVar1 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_90._M_data = (Worker *)((long)&pWVar1->_id + lVar3);
      *(size_t *)((long)&pWVar1->_id + lVar3) = sVar2;
      *(size_t *)((long)&pWVar1->_vtm + lVar3) = sVar2;
      *(Executor **)((long)&pWVar1->_executor + lVar3) = this;
      *(long *)((long)&pWVar1->_waiter + lVar3) =
           (long)&(((this->_notifier)._waiters.
                    super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>.
                    _M_impl.super__Vector_impl_data._M_start)->next)._M_b._M_p + lVar4;
      local_98._M_data = (mutex *)&local_88;
      local_a0._M_data = (condition_variable *)&local_60;
      local_a8._M_data = &local_c0;
      local_b8._M_device = (mutex_type *)this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<tf::Executor::_spawn(unsigned_long)::_lambda(tf::Worker&,std::mutex&,std::condition_variable&,unsigned_long&)_1_,std::reference_wrapper<tf::Worker>,std::reference_wrapper<std::mutex>,std::reference_wrapper<std::condition_variable>,std::reference_wrapper<unsigned_long>>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->_threads,
                 (type *)&local_b8,&local_90,&local_98,&local_a0,&local_a8);
      sVar2 = sVar2 + 1;
      lVar3 = lVar3 + 0x180;
      lVar4 = lVar4 + 0x70;
    } while (N != sVar2);
  }
  local_b8._M_device = (mutex_type *)&local_88;
  local_b8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_b8);
  local_b8._M_owns = true;
  if (local_c0 != N) {
    do {
      std::condition_variable::wait((unique_lock *)&local_60.__data);
    } while (local_c0 != N);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_b8);
  std::condition_variable::~condition_variable((condition_variable *)&local_60.__data);
  return;
}

Assistant:

inline void Executor::_spawn(size_t N) {

  std::mutex mutex;
  std::condition_variable cond;
  size_t n=0;

  for(size_t id=0; id<N; ++id) {

    _workers[id]._id = id;
    _workers[id]._vtm = id;
    _workers[id]._executor = this;
    _workers[id]._waiter = &_notifier._waiters[id];

    _threads.emplace_back([this] (
      Worker& w, std::mutex& mutex, std::condition_variable& cond, size_t& n
    ) -> void {

      // enables the mapping
      {
        std::scoped_lock lock(mutex);
        _wids[std::this_thread::get_id()] = w._id;
        if(n++; n == num_workers()) {
          cond.notify_one();
        }
      }

      //this_worker().worker = &w;

      Node* t = nullptr;

      // must use 1 as condition instead of !done
      while(1) {

        // execute the tasks.
        _exploit_task(w, t);

        // wait for tasks
        if(_wait_for_task(w, t) == false) {
          break;
        }
      }

    }, std::ref(_workers[id]), std::ref(mutex), std::ref(cond), std::ref(n));
  }

  std::unique_lock<std::mutex> lock(mutex);
  cond.wait(lock, [&](){ return n==N; });
}